

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O0

string * ReplaceLine(string *s,int line_index,StringRef new_line)

{
  CStringRef msg;
  undefined8 uVar1;
  char *pcVar2;
  int in_EDX;
  string *in_RSI;
  string *in_RDI;
  size_type end;
  size_type start;
  long local_50;
  int in_stack_ffffffffffffffc4;
  BasicCStringRef<char> in_stack_ffffffffffffffc8;
  char *pcVar3;
  int local_24;
  BasicStringRef<char> local_18;
  
  pcVar3 = (char *)0x0;
  local_24 = in_EDX;
  while( true ) {
    if (local_24 < 1) {
      local_50 = std::__cxx11::string::find((char)in_RSI,10);
      if (local_50 == -1) {
        local_50 = std::__cxx11::string::size();
      }
      pcVar2 = fmt::BasicStringRef<char>::data(&local_18);
      fmt::BasicStringRef<char>::size(&local_18);
      std::__cxx11::string::replace
                ((ulong)in_RSI,(ulong)pcVar3,(char *)(local_50 - (long)pcVar3),(ulong)pcVar2);
      std::__cxx11::string::string((string *)in_RDI,in_RSI);
      return in_RDI;
    }
    msg.data_ = (char *)std::__cxx11::string::find((char)in_RSI,10);
    if (msg.data_ == (char *)0xffffffffffffffff) break;
    pcVar3 = msg.data_ + 1;
    local_24 = local_24 + -1;
  }
  uVar1 = __cxa_allocate_exception(0x18);
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffffc8,"invalid line index");
  mp::Error::Error((Error *)in_stack_ffffffffffffffc8.data_,msg,in_stack_ffffffffffffffc4);
  __cxa_throw(uVar1,&mp::Error::typeinfo,mp::Error::~Error);
}

Assistant:

std::string ReplaceLine(std::string s, int line_index,
                        fmt::StringRef new_line) {
  std::string::size_type start = 0;
  while (line_index-- > 0) {
    start = s.find('\n', start);
    if (start == std::string::npos)
      throw mp::Error("invalid line index");
    ++start;
  }
  std::string::size_type end = s.find('\n', start);
  if (end == std::string::npos)
    end = s.size();
  s.replace(start, end - start, new_line.data(), new_line.size());
  return s;
}